

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O2

int ON_Intersect(ON_Line *line,ON_Arc *arc,double *line_t0,ON_3dPoint *arc_point0,double *line_t1,
                ON_3dPoint *arc_point1)

{
  bool bVar1;
  uint uVar2;
  double *pdVar3;
  uint uVar4;
  double *t_00;
  long lVar5;
  undefined2 *puVar6;
  ON_3dPoint *circle_point0;
  double dVar7;
  double dVar8;
  undefined2 local_16e;
  uint local_16c;
  double t [2];
  ON_3dPoint q;
  ON_Interval arc_domain;
  ON_3dPoint p [2];
  double local_c8 [2];
  ON_Circle c;
  
  memcpy(&c,arc,0x88);
  local_16e = 0;
  circle_point0 = p;
  uVar2 = ON_Intersect(line,&c,t,circle_point0,t + 1,p + 1);
  if (0 < (int)uVar2) {
    arc_domain = ON_Arc::DomainRadians(arc);
    puVar6 = &local_16e;
    local_16c = 1;
    for (lVar5 = 0; (ulong)uVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
      t_00 = (double *)((long)local_c8 + lVar5);
      bVar1 = ON_Circle::ClosestPointTo(&c,circle_point0,t_00);
      *(bool *)puVar6 = bVar1;
      if (bVar1) {
        dVar7 = ON_Interval::NormalizedParameterAt(&arc_domain,*t_00);
        if (0.0 <= dVar7) {
          if (1.0 < dVar7) {
            if (1.0000000149011612 < dVar7) goto LAB_004d5f0e;
            pdVar3 = ON_Interval::operator[](&arc_domain,1);
            dVar7 = *pdVar3;
            *t_00 = dVar7;
            ON_Circle::PointAt(&q,&c,dVar7);
            goto LAB_004d5f34;
          }
        }
        else {
          if (dVar7 < -1.490116119385e-08) {
LAB_004d5f0e:
            bVar1 = false;
          }
          else {
            pdVar3 = ON_Interval::operator[](&arc_domain,0);
            dVar7 = *pdVar3;
            *t_00 = dVar7;
            ON_Circle::PointAt(&q,&c,dVar7);
LAB_004d5f34:
            circle_point0->z = q.z;
            circle_point0->x = q.x;
            circle_point0->y = q.y;
            bVar1 = ON_Line::ClosestPointTo(line,circle_point0,(double *)((long)t + lVar5));
          }
          *(bool *)puVar6 = bVar1;
        }
      }
      puVar6 = (undefined2 *)((long)puVar6 + 1);
      circle_point0 = circle_point0 + 1;
    }
    uVar4 = 0;
    if ((((byte)local_16e | local_16e._1_1_) & 1) != 0) {
      uVar4 = uVar2;
    }
    if (uVar4 == 2) {
      if ((local_16e & 1) == 0) {
        t[0] = t[1];
        p[0].x = p[1].x;
        p[0].y = p[1].y;
        p[0].z = p[1].z;
        uVar2 = 0;
        if ((local_16e & 0x100) == 0) goto LAB_004d6114;
      }
      else if ((local_16e & 0x100) != 0) {
        if ((t[0] != t[1]) || (NAN(t[0]) || NAN(t[1]))) {
          local_16c = 2;
        }
        else {
          ON_Line::PointAt(&q,line,t[0]);
          dVar7 = ON_3dPoint::DistanceTo(p,&q);
          dVar8 = ON_3dPoint::DistanceTo(p + 1,&q);
          if (dVar8 < dVar7) {
            local_c8[0] = local_c8[1];
            t[0] = t[1];
            p[0].x = p[1].x;
            p[0].y = p[1].y;
            p[0].z = p[1].z;
          }
        }
      }
    }
    else {
      uVar2 = (uint)(byte)local_16e;
      if (uVar4 != 1) {
        uVar2 = uVar4;
      }
      local_16c = uVar2;
      if ((int)uVar2 < 1) goto LAB_004d6114;
    }
    if (line_t0 != (double *)0x0) {
      *line_t0 = t[0];
    }
    arc_point0->z = p[0].z;
    arc_point0->x = p[0].x;
    arc_point0->y = p[0].y;
    uVar2 = local_16c;
    if (local_16c == 2) {
      if (line_t1 != (double *)0x0) {
        *line_t1 = t[1];
      }
      uVar2 = 2;
      arc_point1->z = p[1].z;
      arc_point1->x = p[1].x;
      arc_point1->y = p[1].y;
    }
  }
LAB_004d6114:
  ON_Plane::~ON_Plane(&c.plane);
  return uVar2;
}

Assistant:

int ON_Intersect(
      const ON_Line& line, 
      const ON_Arc& arc,
      double* line_t0,
      ON_3dPoint& arc_point0,
      double* line_t1,
      ON_3dPoint& arc_point1
      )
{
  // RH-48633 In V7 and earlier there were cases where 1 was returned and the 
  // returned arc_point0 is the closest point on the arc to the line but not an
  // intersection point
  ON_Circle c = arc;
  ON_3dPoint p[2];
  double t[2], a[2], s;
  bool b[2] = {false,false};
  int i, xcnt = ON_Intersect( line, c, &t[0], p[0], &t[1], p[1] );
 
  if ( xcnt > 0 )
  {
    // make sure points are on the arc;
    ON_Interval arc_domain = arc.DomainRadians();
    for ( i = 0; i < xcnt; i++ )
    {
      b[i] = c.ClosestPointTo(p[i], &a[i]);
      if ( b[i] )
      {
        s = arc_domain.NormalizedParameterAt(a[i]);
        if ( s < 0.0 )
        {
          if ( s >= -ON_SQRT_EPSILON )
          {
            a[i] = arc_domain[0];
            p[i] = c.PointAt(a[i]);
            b[i] = line.ClosestPointTo( p[i], &t[i] );
          }
          else
            b[i] = false;
        }
        else if ( s > 1.0 )
        {
          if ( s <= 1.0+ON_SQRT_EPSILON )
          {
            a[i] = arc_domain[1];
            p[i] = c.PointAt(a[i]);
            b[i] = line.ClosestPointTo( p[i], &t[i] );
          }
          else
            b[i] = false;
        }
      }
    }
    if ( !b[0] && !b[1] )
      xcnt = 0;

    if ( xcnt == 2 )
    {
      if ( !b[1] )
        xcnt = 1;
      if ( !b[0] )
      {
        xcnt = 1;
        b[0] = b[1];
        t[0] = t[1];
        a[0] = a[1];
        p[0] = p[1];
        b[1] = 0;
      }
      if ( xcnt == 2 && t[0] == t[1] )
      {
        xcnt = 1;
        b[1] = 0;
        ON_3dPoint q = line.PointAt(t[0]);
        if ( p[0].DistanceTo(q) > p[1].DistanceTo(q) )
        {
          a[0] = a[1];
          t[0] = t[1];
          p[0] = p[1];
        }
      }
    }
    if  ( xcnt == 1 && !b[0] )
      xcnt = 0;
    if ( xcnt >= 1 )
    {
      if ( line_t0 )
        *line_t0 = t[0];
      arc_point0 = p[0];
    }
    if ( xcnt == 2 )
    {
      if ( line_t1 )
        *line_t1 = t[1];
      arc_point1 = p[1];
    }
  }
  return xcnt;
}